

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void promise_reaction_data_free(JSRuntime *rt,JSPromiseReactionData *rd)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSRuntime *in_RSI;
  JSValueUnion in_RDI;
  int64_t unaff_retaddr;
  void *in_stack_ffffffffffffffe8;
  
  v.tag = unaff_retaddr;
  v.u.ptr = in_RDI.ptr;
  JS_FreeValueRT(in_RSI,v);
  v_00.tag = unaff_retaddr;
  v_00.u.ptr = in_RDI.ptr;
  JS_FreeValueRT(in_RSI,v_00);
  v_01.tag = unaff_retaddr;
  v_01.u.ptr = in_RDI.ptr;
  JS_FreeValueRT(in_RSI,v_01);
  js_free_rt(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void promise_reaction_data_free(JSRuntime *rt,
                                       JSPromiseReactionData *rd)
{
    JS_FreeValueRT(rt, rd->resolving_funcs[0]);
    JS_FreeValueRT(rt, rd->resolving_funcs[1]);
    JS_FreeValueRT(rt, rd->handler);
    js_free_rt(rt, rd);
}